

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonEachComputePath(JsonEachCursor *p,JsonString *pStr,u32 i)

{
  uint i_00;
  JsonNode *pJVar1;
  
  if (i == 0) {
    jsonAppendChar(pStr,'$');
    return;
  }
  i_00 = (p->sParse).aUp[i];
  jsonEachComputePath(p,pStr,i_00);
  pJVar1 = (p->sParse).aNode;
  if (pJVar1[i_00].eType == '\x06') {
    jsonPrintf(0x1e,pStr,"[%d]",(ulong)pJVar1[i_00].u.iAppend);
    return;
  }
  jsonAppendObjectPathElement
            (pStr,pJVar1 + (ulong)i + ((ulong)((pJVar1[i].jnFlags & 0x40) >> 6) - 1));
  return;
}

Assistant:

static void jsonEachComputePath(
  JsonEachCursor *p,       /* The cursor */
  JsonString *pStr,        /* Write the path here */
  u32 i                    /* Path to this element */
){
  JsonNode *pNode, *pUp;
  u32 iUp;
  if( i==0 ){
    jsonAppendChar(pStr, '$');
    return;
  }
  iUp = p->sParse.aUp[i];
  jsonEachComputePath(p, pStr, iUp);
  pNode = &p->sParse.aNode[i];
  pUp = &p->sParse.aNode[iUp];
  if( pUp->eType==JSON_ARRAY ){
    assert( pUp->eU==3 || (pUp->eU==0 && pUp->u.iKey==0) );
    testcase( pUp->eU==0 );
    jsonPrintf(30, pStr, "[%d]", pUp->u.iKey);
  }else{
    assert( pUp->eType==JSON_OBJECT );
    if( (pNode->jnFlags & JNODE_LABEL)==0 ) pNode--;
    jsonAppendObjectPathElement(pStr, pNode);
  }
}